

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_subcapture.c
# Opt level: O2

int main(int argc,char **args)

{
  size_t sVar1;
  light_pcapng section;
  char *pcVar2;
  uint32_t *__ptr;
  FILE *__s;
  long lVar3;
  char *__s_00;
  char *pcVar4;
  light_pcapng subcapture;
  light_option local_10a8;
  char **local_10a0;
  long local_1098;
  size_t subcapture_size;
  char comment [73];
  char subcapture_name [4096];
  
  pcVar4 = "This pcapng file was created using LightPcapNg subcapture functionality.";
  pcVar2 = comment;
  for (lVar3 = 0x49; lVar3 != 0; lVar3 = lVar3 + -1) {
    *pcVar2 = *pcVar4;
    pcVar4 = pcVar4 + 1;
    pcVar2 = pcVar2 + 1;
  }
  local_10a0 = args;
  sVar1 = strlen(comment);
  local_10a8 = light_create_option(0xb00b,(uint16_t)sVar1,comment);
  local_1098 = (long)argc;
  for (lVar3 = 1; lVar3 < local_1098; lVar3 = lVar3 + 1) {
    pcVar4 = local_10a0[lVar3];
    section = light_read_from_path(pcVar4);
    if (section == (light_pcapng)0x0) {
      fprintf(_stderr,"Unable to read pcapng: %s\n",pcVar4);
    }
    else {
      subcapture = (light_pcapng)0x0;
      memset(subcapture_name,0,0x1000);
      do {
        __s_00 = pcVar4;
        pcVar2 = strchr(__s_00,0x2f);
        pcVar4 = pcVar2 + 1;
      } while (pcVar2 != (char *)0x0);
      light_subcapture(section,subcapture_predicate,&subcapture);
      light_add_option(subcapture,subcapture,local_10a8,LIGHT_TRUE);
      __ptr = light_pcapng_to_memory(subcapture,&subcapture_size);
      sprintf(subcapture_name,"subcapture_%s",__s_00);
      printf("Write subcapture to %s\n",subcapture_name);
      __s = fopen(subcapture_name,"wb");
      fwrite(__ptr,1,subcapture_size,__s);
      fclose(__s);
      free(__ptr);
      light_pcapng_release(subcapture);
      light_pcapng_release(section);
    }
  }
  light_free_option(local_10a8);
  return 0;
}

Assistant:

int main(int argc, const char **args) {
	int i;
	char comment[] = "This pcapng file was created using LightPcapNg subcapture functionality.";
	light_option option = light_create_option(0xB00B, strlen(comment), comment);

	for (i = 1; i < argc; ++i) {
		const char *file = args[i];
		light_pcapng pcapng = light_read_from_path(file);
		if (pcapng != NULL) {
			light_pcapng subcapture = NULL;
			uint32_t *subcapture_mem;
			size_t subcapture_size;
			FILE *subcapture_file;
			char subcapture_name[PATH_MAX] = {0,};
			const char *file_name = file;
			char *offset;

			while ((offset = strstr(file_name, "/")) != NULL)
				file_name = offset + 1;

			light_subcapture(pcapng, subcapture_predicate, &subcapture);
			light_add_option(subcapture, subcapture, option, LIGHT_TRUE);
			subcapture_mem = light_pcapng_to_memory(subcapture, &subcapture_size);

			sprintf(subcapture_name, "subcapture_%s", file_name);
			printf("Write subcapture to %s\n", subcapture_name);
			subcapture_file = fopen(subcapture_name, "wb");
			fwrite(subcapture_mem, 1, subcapture_size, subcapture_file);
			fclose(subcapture_file);

			free(subcapture_mem);
			light_pcapng_release(subcapture);
			light_pcapng_release(pcapng);
		}
		else {
			fprintf(stderr, "Unable to read pcapng: %s\n", file);
		}
	}

	light_free_option(option);
	return 0;
}